

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int set_ports_option(mg_context *phys_ctx)

{
  undefined8 *puVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  char *list;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  long lVar10;
  socket *__ptr;
  pollfd *ppVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  char *pcVar15;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *func;
  char *func_00;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  ulong uVar16;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *func_01;
  mg_context *ctx;
  char *extraout_RDX_14;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  char *fmt;
  int len_1;
  uint port;
  mg_context *local_258;
  vec vec;
  socklen_t len;
  undefined1 local_238 [6];
  ushort uStack_232;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 auStack_200 [5];
  bool bStack_1fb;
  undefined2 uStack_1fa;
  int on;
  ulong local_1f0;
  int off;
  uint d;
  uint c;
  uint b;
  uint a;
  char *endptr;
  usa usa;
  char buf [100];
  char local_138 [264];
  
  on = 1;
  off = 0;
  usa._0_8_ = 0;
  usa._8_4_ = 0;
  usa._12_4_ = 0;
  usa._16_4_ = 0;
  usa._20_8_ = 0;
  len = 0x1c;
  uVar6 = 0;
  list = next_option((phys_ctx->dd).config[0],&vec,(vec *)0x0);
  if (list != (char *)0x0) {
    uVar19 = 0;
    local_1f0 = 0;
    local_258 = phys_ctx;
    do {
      uVar18 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar18;
      buf[0x60] = '\0';
      buf[0x61] = '\0';
      buf[0x62] = '\0';
      buf[99] = '\0';
      buf[0x50] = '\0';
      buf[0x51] = '\0';
      buf[0x52] = '\0';
      buf[0x53] = '\0';
      buf[0x54] = '\0';
      buf[0x55] = '\0';
      buf[0x56] = '\0';
      buf[0x57] = '\0';
      buf[0x58] = '\0';
      buf[0x59] = '\0';
      buf[0x5a] = '\0';
      buf[0x5b] = '\0';
      buf[0x5c] = '\0';
      buf[0x5d] = '\0';
      buf[0x5e] = '\0';
      buf[0x5f] = '\0';
      buf[0x40] = '\0';
      buf[0x41] = '\0';
      buf[0x42] = '\0';
      buf[0x43] = '\0';
      buf[0x44] = '\0';
      buf[0x45] = '\0';
      buf[0x46] = '\0';
      buf[0x47] = '\0';
      buf[0x48] = '\0';
      buf[0x49] = '\0';
      buf[0x4a] = '\0';
      buf[0x4b] = '\0';
      buf[0x4c] = '\0';
      buf[0x4d] = '\0';
      buf[0x4e] = '\0';
      buf[0x4f] = '\0';
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      uStack_230 = 0;
      local_228 = 0;
      uStack_220 = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_208 = 0;
      _auStack_200 = 0;
      _local_238 = 0x200000000;
      port = 0;
      len_1 = 0;
      iVar5 = __isoc99_sscanf(vec.ptr,"%u.%u.%u.%u:%u%n",&a,&b,&c,&d,&port,&len_1);
      if (iVar5 == 5) {
        uVar6 = c << 8 | b << 0x10 | a << 0x18 | d;
        uStack_230 = CONCAT44(uStack_230._4_4_,
                              uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              d << 0x18);
        uVar7 = (ulong)port;
        _local_238 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_238);
        uVar6 = 4;
        pcVar15 = extraout_RDX;
LAB_00114ef4:
        uVar13 = (ulong)len_1;
        uVar16 = CONCAT44(vec.len._4_4_,(uint)vec.len);
        if ((((long)uVar13 < 1) || (0xffff < (uint)uVar7)) ||
           (uVar7 = uVar13 + 1,
           pcVar15 = (char *)CONCAT71((int7)(uVar7 >> 8),uVar7 == uVar16 || uVar16 == uVar13),
           uVar7 != uVar16 && uVar16 != uVar13)) goto LAB_00115222;
        if (uVar13 < uVar16) {
          bVar2 = vec.ptr[uVar13];
          _auStack_200 = CONCAT15(bVar2 == 0x72,CONCAT14(bVar2 == 0x73,auStack_200._0_4_));
          uVar12 = bVar2 - 0x72;
          if ((1 < uVar12) && (bVar2 != 0)) goto LAB_00115222;
        }
        else {
          _auStack_200 = (uint6)(uint)auStack_200._0_4_;
          uVar12 = len_1;
        }
        iVar5 = socket((uint)(ushort)local_238._4_2_,1,6);
        _local_238 = CONCAT44(stack0xfffffffffffffdcc,iVar5);
        if (iVar5 == -1) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,phys_ctx,func,uVar12,"cannot create socket (entry %i)",
                     uVar19);
        }
        else {
          piVar14 = &on;
          iVar5 = setsockopt(iVar5,1,2,piVar14,4);
          uVar12 = (uint)piVar14;
          pcVar15 = func_00;
          if (iVar5 != 0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,func_00,uVar12,
                       "cannot set socket option SO_REUSEADDR (entry %i)",uVar19);
            pcVar15 = extraout_RDX_02;
          }
          if (uVar6 < 5) {
LAB_001152c5:
          }
          else if (uVar6 < 7) {
            if (local_238._4_2_ == 10) {
              piVar14 = &on;
              iVar5 = setsockopt(local_238._0_4_,0x29,0x1a,piVar14,4);
              uVar12 = (uint)piVar14;
              pcVar20 = "cannot set socket option IPV6_V6ONLY=on (entry %i)";
              pcVar15 = extraout_RDX_07;
              goto LAB_001152b2;
            }
          }
          else if (local_238._4_2_ == 10) {
            piVar14 = &off;
            iVar5 = setsockopt(local_238._0_4_,0x29,0x1a,piVar14,4);
            uVar12 = (uint)piVar14;
            pcVar20 = "cannot set socket option IPV6_V6ONLY=off (entry %i)";
            pcVar15 = extraout_RDX_03;
LAB_001152b2:
            if (iVar5 != 0) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,phys_ctx,pcVar15,uVar12,pcVar20,(ulong)uVar18);
              pcVar15 = extraout_RDX_08;
            }
            goto LAB_001152c5;
          }
          if (local_238._4_2_ == 10) {
            len = 0x1c;
            iVar5 = bind(local_238._0_4_,(sockaddr *)(local_238 + 4),0x1c);
            uVar6 = (uint)vec.len;
            pcVar15 = vec.ptr;
            if (iVar5 == 0) {
LAB_001153d6:
              pcVar15 = (phys_ctx->dd).config[7];
              lVar10 = strtol(pcVar15,(char **)0x0,10);
              uVar7 = lVar10 - 0x80000000;
              if (uVar7 < 0xffffffff80000001) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,phys_ctx,(char *)0xffffffff80000000,(uint)uVar7,
                           "%s value \"%s\" is invalid","listen_backlog",pcVar15);
LAB_00115427:
                close(local_238._0_4_);
                _local_238 = CONCAT44(stack0xfffffffffffffdcc,0xffffffff);
                goto LAB_0011524a;
              }
              iVar5 = listen(local_238._0_4_,(int)lVar10);
              uVar6 = (uint)vec.len;
              pcVar15 = vec.ptr;
              uVar12 = (uint)uVar7;
              if (iVar5 == 0) {
                iVar5 = getsockname(local_238._0_4_,(sockaddr *)&usa.sa,&len);
                phys_ctx = local_258;
                if (iVar5 == 0) {
                  if (usa.sa.sa_family == local_238._4_2_) {
                    _local_238 = CONCAT26(usa.sin.sin_port,local_238);
                    __ptr = (socket *)
                            realloc(local_258->listening_sockets,
                                    (ulong)(local_258->num_listening_sockets + 1) << 6);
                    if (__ptr != (socket *)0x0) {
                      ppVar11 = (pollfd *)
                                realloc(phys_ctx->listening_socket_fds,
                                        (ulong)(phys_ctx->num_listening_sockets + 1) << 3);
                      if (ppVar11 == (pollfd *)0x0) {
                        mg_cry_internal_wrap
                                  ((mg_connection *)0x0,phys_ctx,(char *)ctx,uVar12,"%s",
                                   "Out of memory");
                        close(local_238._0_4_);
                        _local_238 = CONCAT44(stack0xfffffffffffffdcc,0xffffffff);
                        free(__ptr);
                      }
                      else {
                        set_close_on_exec(local_238._0_4_,(mg_connection *)phys_ctx,ctx);
                        phys_ctx->listening_sockets = __ptr;
                        uVar6 = phys_ctx->num_listening_sockets;
                        puVar1 = (undefined8 *)((long)&__ptr[uVar6].rsa + 0x10);
                        *puVar1 = local_208;
                        puVar1[1] = _auStack_200;
                        *(undefined8 *)&__ptr[uVar6].rsa = local_218;
                        *(undefined8 *)((long)&__ptr[uVar6].rsa + 8) = uStack_210;
                        puVar1 = (undefined8 *)((long)&__ptr[uVar6].lsa + 0xc);
                        *puVar1 = local_228;
                        puVar1[1] = uStack_220;
                        *(undefined8 *)(__ptr + uVar6) = _local_238;
                        *(undefined8 *)((long)&__ptr[uVar6].lsa + 4) = uStack_230;
                        phys_ctx->listening_socket_fds = ppVar11;
                        phys_ctx->num_listening_sockets = uVar6 + 1;
                        local_1f0 = (ulong)((int)local_1f0 + 1);
                      }
                      goto LAB_0011524a;
                    }
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,phys_ctx,func_01,uVar12,"%s","Out of memory");
                    goto LAB_00115427;
                  }
                }
                puVar8 = (uint *)__errno_location();
                uVar6 = (uint)vec.len;
                pcVar15 = vec.ptr;
                uVar12 = *puVar8;
                pcVar9 = strerror(uVar12);
                fmt = "call to getsockname failed %.*s: %d (%s)";
                pcVar20 = extraout_RDX_14;
              }
              else {
                puVar8 = (uint *)__errno_location();
                uVar12 = *puVar8;
                pcVar9 = strerror(uVar12);
                fmt = "cannot listen to %.*s: %d (%s)";
                pcVar20 = extraout_RDX_13;
              }
            }
            else {
              puVar8 = (uint *)__errno_location();
              uVar12 = *puVar8;
              pcVar9 = strerror(uVar12);
              fmt = "cannot bind to IPv6 %.*s: %d (%s)";
              pcVar20 = extraout_RDX_10;
            }
          }
          else {
            if (local_238._4_2_ != 2) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,phys_ctx,pcVar15,uVar12,
                         "cannot bind: address family not supported (entry %i)",(ulong)uVar18);
              close(local_238._0_4_);
              _local_238 = CONCAT44(stack0xfffffffffffffdcc,0xffffffff);
              goto LAB_0011524a;
            }
            len = 0x10;
            iVar5 = bind(local_238._0_4_,(sockaddr *)(local_238 + 4),0x10);
            uVar6 = (uint)vec.len;
            pcVar15 = vec.ptr;
            if (iVar5 == 0) goto LAB_001153d6;
            puVar8 = (uint *)__errno_location();
            uVar12 = *puVar8;
            pcVar9 = strerror(uVar12);
            fmt = "cannot bind to %.*s: %d (%s)";
            pcVar20 = extraout_RDX_09;
          }
          phys_ctx = local_258;
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,local_258,pcVar20,(uint)pcVar9,fmt,(ulong)uVar6,pcVar15,
                     (ulong)uVar12,pcVar9);
          close(local_238._0_4_);
          _local_238 = CONCAT44(stack0xfffffffffffffdcc,0xffffffff);
        }
      }
      else {
        iVar5 = __isoc99_sscanf(vec.ptr,"[%49[^]]]:%u%n",buf,&port);
        if (((iVar5 == 2) && ((ulong)(long)len_1 <= CONCAT44(vec.len._4_4_,(uint)vec.len))) &&
           (iVar5 = mg_inet_pton(10,buf,local_238 + 4,0x1c,0), iVar5 != 0)) {
          uVar7 = (ulong)port;
          _local_238 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_238);
          uVar6 = 6;
          pcVar15 = extraout_RDX_00;
          goto LAB_00114ef4;
        }
        if ((*vec.ptr == '+') &&
           (iVar5 = __isoc99_sscanf(vec.ptr + 1,"%u%n",&port,&len_1), iVar5 == 1)) {
          len_1 = len_1 + 1;
          local_238 = (undefined1  [6])CONCAT24(10,local_238._0_4_);
          uVar7 = (ulong)port;
          _local_238 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_238);
          uVar6 = 10;
          pcVar15 = extraout_RDX_01;
          goto LAB_00114ef4;
        }
        uVar7 = strtoul(vec.ptr,&endptr,0);
        pcVar20 = vec.ptr;
        if ((uVar7 < 0x10000) && (vec.ptr != endptr)) {
          len_1 = (int)endptr - (int)vec.ptr;
          port = (uint)uVar7;
          _local_238 = CONCAT26((ushort)uVar7 << 8 | (ushort)uVar7 >> 8,local_238);
          uVar6 = 4;
          pcVar15 = extraout_RDX_04;
          goto LAB_00114ef4;
        }
        pcVar9 = strchr(vec.ptr,0x3a);
        uVar16 = CONCAT44(vec.len._4_4_,(uint)vec.len);
        pcVar15 = extraout_RDX_05;
        phys_ctx = local_258;
        if ((pcVar9 != (char *)0x0) &&
           (uVar7 = (long)pcVar9 - (long)pcVar20, uVar7 < 0x100 && uVar7 < uVar16)) {
          cVar4 = *pcVar20;
          pcVar15 = local_138;
          uVar16 = uVar7;
          if (pcVar9 != pcVar20 && cVar4 != '\0') {
            do {
              pcVar20 = pcVar20 + 1;
              *pcVar15 = cVar4;
              pcVar15 = pcVar15 + 1;
              cVar4 = *pcVar20;
              if (cVar4 == '\0') break;
              bVar3 = 1 < uVar16;
              uVar16 = uVar16 - 1;
            } while (bVar3);
          }
          iVar17 = (int)uVar7 + 1;
          *pcVar15 = '\0';
          iVar5 = mg_inet_pton(2,local_138,local_238 + 4,0x10,1);
          if (iVar5 == 0) {
            iVar5 = mg_inet_pton(10,local_138,local_238 + 4,0x1c,1);
            if (iVar5 == 0) {
              len_1 = 0;
              uVar6 = 0;
              pcVar15 = extraout_RDX_11;
            }
            else {
              iVar5 = __isoc99_sscanf(pcVar9 + 1,"%u%n",&port,&len_1);
              pcVar15 = extraout_RDX_12;
              if (iVar5 != 1) goto LAB_001154ac;
              _local_238 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_238);
              len_1 = len_1 + iVar17;
              uVar6 = 6;
            }
          }
          else {
            iVar5 = __isoc99_sscanf(pcVar9 + 1,"%u%n",&port,&len_1);
            pcVar15 = extraout_RDX_06;
            if (iVar5 == 1) {
              _local_238 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_238);
              len_1 = len_1 + iVar17;
              uVar6 = 4;
            }
            else {
LAB_001154ac:
              len_1 = 0;
              uVar6 = 0;
            }
          }
          uVar7 = (ulong)port;
          phys_ctx = local_258;
          goto LAB_00114ef4;
        }
LAB_00115222:
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,pcVar15,0x12d863,
                   "%.*s: invalid port spec (entry %i). Expecting list of: %s",uVar16,vec.ptr,uVar19
                   ,"[IP_ADDRESS:]PORT[s|r]");
      }
LAB_0011524a:
      list = next_option(list,&vec,(vec *)0x0);
    } while (list != (char *)0x0);
    uVar6 = (uint)local_1f0;
    if (uVar6 != uVar18) {
      close_all_listening_sockets(phys_ctx);
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

static int
set_ports_option(struct mg_context *phys_ctx)
{
	const char *list;
	int on = 1;
#if defined(USE_IPV6)
	int off = 0;
#endif
	struct vec vec;
	struct socket so, *ptr;

	struct mg_pollfd *pfd;
	union usa usa;
	socklen_t len;
	int ip_version;

	int portsTotal = 0;
	int portsOk = 0;

	const char *opt_txt;
	long opt_listen_backlog;

	if (!phys_ctx) {
		return 0;
	}

	memset(&so, 0, sizeof(so));
	memset(&usa, 0, sizeof(usa));
	len = sizeof(usa);
	list = phys_ctx->dd.config[LISTENING_PORTS];

	while ((list = next_option(list, &vec, NULL)) != NULL) {

		portsTotal++;

		if (!parse_port_string(&vec, &so, &ip_version)) {
			mg_cry_ctx_internal(
			    phys_ctx,
			    "%.*s: invalid port spec (entry %i). Expecting list of: %s",
			    (int)vec.len,
			    vec.ptr,
			    portsTotal,
			    "[IP_ADDRESS:]PORT[s|r]");
			continue;
		}

#if !defined(NO_SSL)
		if (so.is_ssl && phys_ctx->dd.ssl_ctx == NULL) {

			mg_cry_ctx_internal(phys_ctx,
			                    "Cannot add SSL socket (entry %i)",
			                    portsTotal);
			continue;
		}
#endif
		/* Create socket. */
		/* For a list of protocol numbers (e.g., TCP==6) see:
		 * https://www.iana.org/assignments/protocol-numbers/protocol-numbers.xhtml
		 */
		if ((so.sock =
		         socket(so.lsa.sa.sa_family,
		                SOCK_STREAM,
		                (ip_version == 99) ? (/* LOCAL */ 0) : (/* TCP */ 6)))
		    == INVALID_SOCKET) {

			mg_cry_ctx_internal(phys_ctx,
			                    "cannot create socket (entry %i)",
			                    portsTotal);
			continue;
		}

#if defined(_WIN32)
		/* Windows SO_REUSEADDR lets many procs binds to a
		 * socket, SO_EXCLUSIVEADDRUSE makes the bind fail
		 * if someone already has the socket -- DTL */
		/* NOTE: If SO_EXCLUSIVEADDRUSE is used,
		 * Windows might need a few seconds before
		 * the same port can be used again in the
		 * same process, so a short Sleep may be
		 * required between mg_stop and mg_start.
		 */
		if (setsockopt(so.sock,
		               SOL_SOCKET,
		               SO_EXCLUSIVEADDRUSE,
		               (SOCK_OPT_TYPE)&on,
		               sizeof(on))
		    != 0) {

			/* Set reuse option, but don't abort on errors. */
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot set socket option SO_EXCLUSIVEADDRUSE (entry %i)",
			    portsTotal);
		}
#else
		if (setsockopt(so.sock,
		               SOL_SOCKET,
		               SO_REUSEADDR,
		               (SOCK_OPT_TYPE)&on,
		               sizeof(on))
		    != 0) {

			/* Set reuse option, but don't abort on errors. */
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot set socket option SO_REUSEADDR (entry %i)",
			    portsTotal);
		}
#endif

#if defined(USE_X_DOM_SOCKET)
		if (ip_version == 99) {
			/* Unix domain socket */
		} else
#endif

		    if (ip_version > 4) {
			/* Could be 6 for IPv6 onlyor 10 (4+6) for IPv4+IPv6 */
#if defined(USE_IPV6)
			if (ip_version > 6) {
				if (so.lsa.sa.sa_family == AF_INET6
				    && setsockopt(so.sock,
				                  IPPROTO_IPV6,
				                  IPV6_V6ONLY,
				                  (void *)&off,
				                  sizeof(off))
				           != 0) {

					/* Set IPv6 only option, but don't abort on errors. */
					mg_cry_ctx_internal(phys_ctx,
					                    "cannot set socket option "
					                    "IPV6_V6ONLY=off (entry %i)",
					                    portsTotal);
				}
			} else {
				if (so.lsa.sa.sa_family == AF_INET6
				    && setsockopt(so.sock,
				                  IPPROTO_IPV6,
				                  IPV6_V6ONLY,
				                  (void *)&on,
				                  sizeof(on))
				           != 0) {

					/* Set IPv6 only option, but don't abort on errors. */
					mg_cry_ctx_internal(phys_ctx,
					                    "cannot set socket option "
					                    "IPV6_V6ONLY=on (entry %i)",
					                    portsTotal);
				}
			}
#else
			mg_cry_ctx_internal(phys_ctx, "%s", "IPv6 not available");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
#endif
		}

		if (so.lsa.sa.sa_family == AF_INET) {

			len = sizeof(so.lsa.sin);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to %.*s: %d (%s)",
				                    (int)vec.len,
				                    vec.ptr,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#if defined(USE_IPV6)
		else if (so.lsa.sa.sa_family == AF_INET6) {

			len = sizeof(so.lsa.sin6);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to IPv6 %.*s: %d (%s)",
				                    (int)vec.len,
				                    vec.ptr,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#endif
#if defined(USE_X_DOM_SOCKET)
		else if (so.lsa.sa.sa_family == AF_UNIX) {

			len = sizeof(so.lsa.sun);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to unix socket %s: %d (%s)",
				                    so.lsa.sun.sun_path,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#endif
		else {
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot bind: address family not supported (entry %i)",
			    portsTotal);
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		opt_txt = phys_ctx->dd.config[LISTEN_BACKLOG_SIZE];
		opt_listen_backlog = strtol(opt_txt, NULL, 10);
		if ((opt_listen_backlog > INT_MAX) || (opt_listen_backlog < 1)) {
			mg_cry_ctx_internal(phys_ctx,
			                    "%s value \"%s\" is invalid",
			                    config_options[LISTEN_BACKLOG_SIZE].name,
			                    opt_txt);
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if (listen(so.sock, (int)opt_listen_backlog) != 0) {

			mg_cry_ctx_internal(phys_ctx,
			                    "cannot listen to %.*s: %d (%s)",
			                    (int)vec.len,
			                    vec.ptr,
			                    (int)ERRNO,
			                    strerror(errno));
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if ((getsockname(so.sock, &(usa.sa), &len) != 0)
		    || (usa.sa.sa_family != so.lsa.sa.sa_family)) {

			int err = (int)ERRNO;
			mg_cry_ctx_internal(phys_ctx,
			                    "call to getsockname failed %.*s: %d (%s)",
			                    (int)vec.len,
			                    vec.ptr,
			                    err,
			                    strerror(errno));
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		/* Update lsa port in case of random free ports */
#if defined(USE_IPV6)
		if (so.lsa.sa.sa_family == AF_INET6) {
			so.lsa.sin6.sin6_port = usa.sin6.sin6_port;
		} else
#endif
		{
			so.lsa.sin.sin_port = usa.sin.sin_port;
		}

		if ((ptr = (struct socket *)
		         mg_realloc_ctx(phys_ctx->listening_sockets,
		                        (phys_ctx->num_listening_sockets + 1)
		                            * sizeof(phys_ctx->listening_sockets[0]),
		                        phys_ctx))
		    == NULL) {

			mg_cry_ctx_internal(phys_ctx, "%s", "Out of memory");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if ((pfd = (struct mg_pollfd *)
		         mg_realloc_ctx(phys_ctx->listening_socket_fds,
		                        (phys_ctx->num_listening_sockets + 1)
		                            * sizeof(phys_ctx->listening_socket_fds[0]),
		                        phys_ctx))
		    == NULL) {

			mg_cry_ctx_internal(phys_ctx, "%s", "Out of memory");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			mg_free(ptr);
			continue;
		}

		set_close_on_exec(so.sock, NULL, phys_ctx);
		phys_ctx->listening_sockets = ptr;
		phys_ctx->listening_sockets[phys_ctx->num_listening_sockets] = so;
		phys_ctx->listening_socket_fds = pfd;
		phys_ctx->num_listening_sockets++;
		portsOk++;
	}

	if (portsOk != portsTotal) {
		close_all_listening_sockets(phys_ctx);
		portsOk = 0;
	}

	return portsOk;
}